

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCTestResourceGroups.cxx
# Opt level: O0

bool TestExpectedParseResult(ExpectedParseResult *expected)

{
  bool bVar1;
  ostream *poVar2;
  void *this;
  undefined1 local_30 [7];
  bool retval;
  vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
  result;
  ExpectedParseResult *expected_local;
  
  result.
  super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)expected;
  std::
  vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
  ::vector((vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
            *)local_30);
  bVar1 = cmCTestTestHandler::ParseResourceGroupsProperty
                    ((string *)
                     result.
                     super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                      *)local_30);
  if (bVar1 == (bool)(*(byte *)&result.
                                super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
                                super__Vector_base<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                                ._M_impl.super__Vector_impl_data._M_finish & 1)) {
    bVar1 = std::operator!=((vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                             *)local_30,
                            (vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                             *)&result.
                                super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
                                super__Vector_base<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"ParseResourceGroupsProperty(\"");
      poVar2 = std::operator<<(poVar2,(string *)
                                      result.
                                      super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar2 = std::operator<<(poVar2,"\") did not yield expected set of resource groups");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      expected_local._7_1_ = false;
    }
    else {
      expected_local._7_1_ = true;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"ParseResourceGroupsProperty(\"");
    poVar2 = std::operator<<(poVar2,(string *)
                                    result.
                                    super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar2 = std::operator<<(poVar2,"\") returned ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1);
    poVar2 = std::operator<<(poVar2,", should be ");
    this = (void *)std::ostream::operator<<
                             (poVar2,(bool)(*(byte *)&result.
                                                  super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  [1].
                                                  super__Vector_base<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish & 1));
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    expected_local._7_1_ = false;
  }
  std::
  vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
  ::~vector((vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
             *)local_30);
  return expected_local._7_1_;
}

Assistant:

static bool TestExpectedParseResult(const ExpectedParseResult& expected)
{
  std::vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement>>
    result;
  bool retval;
  if ((retval = cmCTestTestHandler::ParseResourceGroupsProperty(
         expected.String, result)) != expected.ExpectedReturnValue) {
    std::cout << "ParseResourceGroupsProperty(\"" << expected.String
              << "\") returned " << retval << ", should be "
              << expected.ExpectedReturnValue << std::endl;
    return false;
  }

  if (result != expected.ExpectedValue) {
    std::cout << "ParseResourceGroupsProperty(\"" << expected.String
              << "\") did not yield expected set of resource groups"
              << std::endl;
    return false;
  }

  return true;
}